

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O2

void lqGetBinPopulationStats(lqInternalDB *lq,int *min,int *max,float *average)

{
  uint uVar1;
  ulong uVar2;
  lqClientProxy **pplVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  uVar1 = lq->divy * lq->divx * lq->divz;
  uVar4 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  iVar8 = 0;
  iVar9 = 0;
  iVar5 = 0x7fffffff;
  iVar6 = 0;
  while( true ) {
    if (uVar4 == uVar2) break;
    iVar7 = 0;
    for (pplVar3 = lq->bins + uVar4; *pplVar3 != (lqClientProxy *)0x0; pplVar3 = &(*pplVar3)->next)
    {
      iVar7 = iVar7 + 1;
    }
    if (iVar7 != 0) {
      if (iVar6 <= iVar7) {
        iVar6 = iVar7;
      }
      if (iVar7 <= iVar5) {
        iVar5 = iVar7;
      }
      iVar8 = iVar8 + iVar7;
      iVar9 = iVar9 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  *min = iVar5;
  *max = iVar6;
  *average = (float)iVar8 / (float)iVar9;
  return;
}

Assistant:

void lqGetBinPopulationStats (lqInternalDB* lq,
                              int* min,
                              int* max,
                              float* average)
{
    int minPop = INT_MAX;
    int maxPop = 0;
    int totalCount = 0;
    int nonEmptyBinCount = 0;
    int bincount = lq->divx * lq->divy * lq->divz;
    int i;

    for (i=0; i<bincount; i++)
    {
        /* clear the counter */
        int objectCount = 0;

        /* apply counting function to each object in bin[i] */
	lqMapOverAllObjectsInBin (lq->bins[i], lqgbpsCounter, &objectCount);

        /* collect data: max and min population, count objects and non-empty bins */
        if (objectCount > 0)
        {
            nonEmptyBinCount++;
            if (maxPop < objectCount) maxPop = objectCount;
            if (minPop > objectCount) minPop = objectCount;
            totalCount += objectCount;
        }
    }

    /* set return values */
    *min = minPop;
    *max = maxPop;
    *average = ((float) totalCount) / ((float) nonEmptyBinCount);
}